

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalDeclarationStatement.h
# Opt level: O2

void __thiscall
LocalDeclarationStatement::LocalDeclarationStatement
          (LocalDeclarationStatement *this,Identifier *identifier,bool constant,
          ptr<Expression> *expression)

{
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR_execute_00134128;
  std::__cxx11::string::string((string *)&this->identifier,(string *)identifier);
  this->constant = constant;
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>,
             &expression->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

LocalDeclarationStatement(Identifier identifier, bool constant, ptr<Expression> expression)
        : identifier(std::move(identifier)), constant(constant), expression(expression) { }